

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::fragment_index::key(fragment_index *this,string *s)

{
  undefined8 uVar1;
  bool bVar2;
  maybe<pstore::uint128,_void> *pmVar3;
  uint128 *puVar4;
  error_category *extraout_RDX;
  error_code eVar5;
  maybe<pstore::uint128,_void> digest;
  maybe<pstore::uint128,_void> local_38;
  
  pmVar3 = uint128::from_hex_string(&local_38,s);
  bVar2 = local_38.valid_;
  eVar5._M_cat = extraout_RDX;
  eVar5._0_8_ = pmVar3;
  if (local_38.valid_ == true) {
    puVar4 = maybe<pstore::uint128,_void>::operator->(&local_38);
    uVar1 = *(undefined8 *)((long)&puVar4->v_ + 8);
    *(long *)&(this->digest_).v_ = (long)puVar4->v_;
    *(undefined8 *)((long)&(this->digest_).v_ + 8) = uVar1;
    eVar5 = rule::
            push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
                      (&this->super_rule,(this->transaction_).ptr_,(this->names_).ptr_,
                       &this->digest_);
  }
  if (local_38.valid_ == true) {
    local_38.valid_ = false;
  }
  if (bVar2 == false) {
    eVar5 = make_error_code(bad_digest);
  }
  return eVar5;
}

Assistant:

std::error_code fragment_index::key (std::string const & s) {
                if (maybe<index::digest> const digest = uint128::from_hex_string (s)) {
                    digest_ = *digest;
                    return push_object_rule<fragment_sections> (this, transaction_, names_,
                                                                &digest_);
                }
                return error::bad_digest;
            }